

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.cpp
# Opt level: O2

void __thiscall OpenMPClause::addLangExpr(OpenMPClause *this,char *expression,int line,int col)

{
  int iVar1;
  reference ppcVar2;
  uint uVar3;
  char *local_48;
  SourceLocation local_40;
  
  uVar3 = 0;
  local_48 = expression;
  do {
    if ((ulong)((long)(this->expressions).
                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->expressions).
                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= (ulong)uVar3) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                (&this->expressions,&local_48);
      local_40.parent_construct = (SourceLocation *)0x0;
      local_40.line = line;
      local_40.column = col;
      std::vector<SourceLocation,_std::allocator<SourceLocation>_>::emplace_back<SourceLocation>
                (&this->locations,&local_40);
      return;
    }
    ppcVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::at
                        (&this->expressions,(ulong)uVar3);
    iVar1 = strcmp(*ppcVar2,expression);
    uVar3 = uVar3 + 1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void OpenMPClause::addLangExpr(const char *expression, int line, int col) {
    // Since the size of expression vector is supposed to be small, brute force is used here.
    for (unsigned int i = 0; i < this->expressions.size(); i++) {
        if (!strcmp(expressions.at(i), expression)) {
            return;
        };
    };
    expressions.push_back(expression);
    locations.push_back(SourceLocation(line, col));
}